

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::projpt2face(tetgenmesh *this,double *p,double *f1,double *f2,double *f3,double *prj)

{
  double dVar1;
  double dVar2;
  double local_38;
  double local_30;
  double local_28;
  
  facenormal(this,f1,f2,f3,&local_38,1,(double *)0x0);
  dVar1 = SQRT(local_28 * local_28 + local_38 * local_38 + local_30 * local_30);
  dVar2 = (p[2] - f1[2]) * (local_28 / dVar1) +
          (*p - *f1) * (local_38 / dVar1) + (p[1] - f1[1]) * (local_30 / dVar1);
  *prj = *p - (local_38 / dVar1) * dVar2;
  prj[1] = p[1] - (local_30 / dVar1) * dVar2;
  prj[2] = p[2] - dVar2 * (local_28 / dVar1);
  return;
}

Assistant:

void tetgenmesh::projpt2face(REAL* p, REAL* f1, REAL* f2, REAL* f3, REAL* prj)
{
  REAL fnormal[3], v1[3];
  REAL len, dist;

  // Get the unit face normal.
  facenormal(f1, f2, f3, fnormal, 1, NULL);
  len = sqrt(fnormal[0]*fnormal[0] + fnormal[1]*fnormal[1] + 
             fnormal[2]*fnormal[2]);
  fnormal[0] /= len;
  fnormal[1] /= len;
  fnormal[2] /= len;
  // Get the vector v1 = |p - f1|.
  v1[0] = p[0] - f1[0];
  v1[1] = p[1] - f1[1];
  v1[2] = p[2] - f1[2];
  // Get the project distance.
  dist = dot(fnormal, v1);
  
  // Get the project point.
  prj[0] = p[0] - dist * fnormal[0];
  prj[1] = p[1] - dist * fnormal[1];
  prj[2] = p[2] - dist * fnormal[2];
}